

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void finalize_source(parser *p)

{
  io_buf *this;
  int *piVar1;
  int iVar2;
  
  iVar2 = fileno(_stdin);
  while( true ) {
    this = p->input;
    piVar1 = (this->files)._end;
    if (((this->files)._begin == piVar1) || (piVar1[-1] != iVar2)) break;
    (this->files)._end = piVar1 + -1;
  }
  io_buf::close_files(this);
  if (p->input != (io_buf *)0x0) {
    (*p->input->_vptr_io_buf[3])();
  }
  p->input = (io_buf *)0x0;
  io_buf::close_files(p->output);
  if (p->output != (io_buf *)0x0) {
    (*p->output->_vptr_io_buf[3])();
  }
  p->output = (io_buf *)0x0;
  return;
}

Assistant:

void finalize_source(parser* p)
{
#ifdef _WIN32
  int f = _fileno(stdin);
#else
  int f = fileno(stdin);
#endif
  while (!p->input->files.empty() && p->input->files.last() == f) p->input->files.pop();
  p->input->close_files();

  delete p->input;
  p->input = nullptr;
  p->output->close_files();
  delete p->output;
  p->output = nullptr;
}